

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall kj::HttpHeaderTable::~HttpHeaderTable(HttpHeaderTable *this)

{
  HttpHeaderTable *this_local;
  
  Own<kj::HttpHeaderTable::IdsByNameMap,_std::nullptr_t>::~Own(&this->idsByName);
  Vector<kj::StringPtr>::~Vector(&this->namesById);
  return;
}

Assistant:

HttpHeaderTable::~HttpHeaderTable() noexcept(false) {}